

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateDocumentFinal(xmlValidCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlHashTablePtr hash;
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    iVar1 = 0;
  }
  else if (doc == (xmlDocPtr)0x0) {
    iVar1 = 0;
    xmlDoErrValid(ctxt,(xmlNodePtr)0x0,XML_DTD_NO_DOC,2,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0
                  ,0,"xmlValidateDocumentFinal: doc == NULL\n",0);
  }
  else {
    if ((ctxt->flags & 2) == 0) {
      pvVar2 = (void *)0x0;
      uVar3 = 0;
    }
    else {
      pvVar2 = ctxt->userData;
      uVar3 = *(undefined8 *)((long)pvVar2 + 0x38);
      *(undefined8 *)((long)pvVar2 + 0x38) = 0;
    }
    hash = (xmlHashTablePtr)doc->refs;
    ctxt->doc = doc;
    ctxt->valid = 1;
    xmlHashScan(hash,xmlValidateCheckRefCallback,ctxt);
    if ((ctxt->flags & 2) != 0) {
      *(undefined8 *)((long)pvVar2 + 0x38) = uVar3;
    }
    iVar1 = ctxt->valid;
  }
  return iVar1;
}

Assistant:

int
xmlValidateDocumentFinal(xmlValidCtxtPtr ctxt, xmlDocPtr doc) {
    xmlRefTablePtr table;
    xmlParserCtxtPtr pctxt = NULL;
    xmlParserInputPtr oldInput = NULL;

    if (ctxt == NULL)
        return(0);
    if (doc == NULL) {
        xmlErrValid(ctxt, XML_DTD_NO_DOC,
		"xmlValidateDocumentFinal: doc == NULL\n", NULL);
	return(0);
    }

    /*
     * Check all the NOTATION/NOTATIONS attributes
     */
    /*
     * Check all the ENTITY/ENTITIES attributes definition for validity
     */
    /*
     * Check all the IDREF/IDREFS attributes definition for validity
     */

    /*
     * Don't print line numbers.
     */
    if (ctxt->flags & XML_VCTXT_USE_PCTXT) {
        pctxt = ctxt->userData;
        oldInput = pctxt->input;
        pctxt->input = NULL;
    }

    table = (xmlRefTablePtr) doc->refs;
    ctxt->doc = doc;
    ctxt->valid = 1;
    xmlHashScan(table, xmlValidateCheckRefCallback, ctxt);

    if (ctxt->flags & XML_VCTXT_USE_PCTXT)
        pctxt->input = oldInput;

    return(ctxt->valid);
}